

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_38da3::ParseBuildFileDelegate::loadedTarget
          (ParseBuildFileDelegate *this,StringRef name,Target *target)

{
  pointer pcVar1;
  pointer ppNVar2;
  Node **node;
  pointer ppNVar3;
  char *pcVar4;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (this->showOutput == true) {
    pcVar1 = (target->name)._M_dataplus._M_p;
    if (pcVar1 == (pointer)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,pcVar1 + (target->name)._M_string_length);
    }
    printf("target(\'%s\')\n",local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    printf(" -- nodes: [");
    ppNVar3 = (target->nodes).
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppNVar2 = (target->nodes).
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppNVar3 != ppNVar2) {
      pcVar4 = "";
      do {
        pcVar1 = ((*ppNVar3)->name)._M_dataplus._M_p;
        local_50 = &local_40;
        if (pcVar1 == (pointer)0x0) {
          local_48 = 0;
          local_40 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar1,pcVar1 + ((*ppNVar3)->name)._M_string_length);
        }
        printf("%s\'%s\'",pcVar4,local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        ppNVar3 = ppNVar3 + 1;
        pcVar4 = ", ";
      } while (ppNVar3 != ppNVar2);
    }
    puts("]");
  }
  return;
}

Assistant:

void ParseBuildFileDelegate::loadedTarget(StringRef name,
                                          const Target& target) {
  if (showOutput) {
    printf("target('%s')\n", target.getName().str().c_str());

    // Print the nodes in the target.
    bool first = true;
    printf(" -- nodes: [");
    for (const auto& node: target.getNodes()) {
      printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
      first = false;
    }
    printf("]\n");
  }
}